

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLNodeLinOp::buildMasks(MLNodeLinOp *this)

{
  uint uVar1;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  LinOpBCType *pLVar2;
  LinOpBCType *pLVar3;
  bool bVar4;
  int iVar5;
  iterator pvVar6;
  int *piVar7;
  Geometry *pGVar8;
  type piVar9;
  BoxArray *bxs;
  BoxArray *this_00;
  MFInfo *info;
  long in_RDI;
  GpuArray<amrex::LinOpBCType,_3U> GVar10;
  Periodicity PVar11;
  iMultiFab *omask_1;
  Geometry *geom_2;
  int mglev_2;
  int amrlev_3;
  iMultiFab *omask;
  Geometry *geom_1;
  int mglev_1;
  int amrlev_2;
  MFIter mfi_3;
  LayoutData<int> *has_cf;
  int i_6;
  int j_5;
  int k_5;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *cmsk;
  Array4<int> *nmsk;
  Box *bx_2;
  MFIter mfi_2;
  Array4<int> *fab;
  Box *bx_1;
  MFIter mfi_1;
  Box *ccdom;
  LayoutData<int> *has_cf_1;
  iMultiFab *nd_mask;
  iMultiFab *cc_mask;
  int amrlev_1;
  Box tbx;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<const_int> *ccarr;
  Array4<int> *mskarr;
  Box *ndbx;
  MFIter mfi;
  iMultiFab *dmask_fine;
  MFItInfo mfi_info;
  iMultiFab ccm;
  iMultiFab *dmask;
  Box bx;
  Box *nddomain;
  Box *ccdomain;
  Periodicity *period;
  Geometry *geom;
  int mglev;
  int amrlev;
  GpuArray<amrex::LinOpBCType,_3U> hibc;
  GpuArray<amrex::LinOpBCType,_3U> lobc;
  LinOpBCType *ithi;
  LinOpBCType *itlo;
  int i_5;
  int j_4;
  int i_4;
  int j_3;
  int i_3;
  int k_4;
  int i_2;
  int k_3;
  int j_2;
  int k_2;
  int j_1;
  int k_1;
  Dim3 domhi;
  Dim3 domlo;
  int i_1;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int s;
  int i;
  MFIter *in_stack_ffffffffffffeeb8;
  undefined8 *puVar12;
  DistributionMapping *dm;
  LinOpBCType in_stack_ffffffffffffeec0;
  undefined4 in_stack_ffffffffffffeec4;
  FabArray<amrex::IArrayBox> *in_stack_ffffffffffffeec8;
  FabArray<amrex::IArrayBox> *this_01;
  MLLinOp *in_stack_ffffffffffffeed0;
  LinOpBCType *in_stack_ffffffffffffeed8;
  undefined7 in_stack_ffffffffffffeee0;
  uchar in_stack_ffffffffffffeee7;
  LinOpBCType in_stack_ffffffffffffeee8;
  int in_stack_ffffffffffffeeec;
  Geometry *in_stack_ffffffffffffeef0;
  BoxArray *in_stack_ffffffffffffeef8;
  iMultiFab *in_stack_ffffffffffffef00;
  DistributionMapping *dm_00;
  FabFactory<amrex::IArrayBox> *in_stack_ffffffffffffef10;
  MFIter *in_stack_ffffffffffffef20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *factory;
  FabArrayBase *pFVar13;
  LinOpBCType LVar14;
  bool local_1099;
  byte local_1039;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  FabArrayBase *local_fd8;
  Geometry *local_fd0;
  undefined4 local_fc8;
  undefined4 local_fc4;
  DistributionMapping local_fc0;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  FabArrayBase *local_f88;
  CoarseningStrategy strategy;
  undefined4 uVar15;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffff090;
  FabArrayBase *in_stack_fffffffffffff098;
  iMultiFab *in_stack_fffffffffffff0a0;
  MultiFab *in_stack_fffffffffffff0a8;
  value_type in_stack_fffffffffffff0c4;
  value_type in_stack_fffffffffffff0c8;
  value_type in_stack_fffffffffffff0cc;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff0d0;
  Box *in_stack_fffffffffffff0d8;
  undefined4 in_stack_fffffffffffff0e0;
  int in_stack_fffffffffffff0e4;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff0e8;
  char *in_stack_fffffffffffff0f0;
  int local_f04;
  int local_f00;
  int local_efc;
  long local_eb8;
  long local_eb0;
  long local_ea8;
  int local_e98;
  int local_e94;
  int local_e90;
  long *local_e78;
  long local_e70 [8];
  long *local_e30;
  int local_e24 [7];
  int *local_e08;
  MFIter local_e00;
  undefined8 local_da0;
  LinOpBCType local_d98;
  MFIter *local_d90;
  LinOpBCType local_d88;
  undefined8 local_d84;
  LinOpBCType local_d7c;
  value_type in_stack_fffffffffffff2b0;
  Periodicity *in_stack_fffffffffffff2d8;
  undefined8 in_stack_fffffffffffff2e0;
  undefined4 in_stack_fffffffffffff2e8;
  undefined4 in_stack_fffffffffffff2ec;
  undefined8 in_stack_fffffffffffff2f0;
  undefined8 in_stack_fffffffffffff2f8;
  undefined8 in_stack_fffffffffffff300;
  int in_stack_fffffffffffff330;
  int in_stack_fffffffffffff338;
  LayoutData<int> *in_stack_fffffffffffff340;
  IntVect local_c8c;
  int local_c80 [3];
  undefined8 local_c70;
  int local_c68;
  Box *local_ae0;
  FabArray<amrex::IArrayBox> *local_ad8;
  type local_ad0;
  FabArrayBase *local_ac8;
  int local_ac0;
  Box local_abc;
  iterator local_aa0;
  iterator local_a88;
  undefined1 local_a70 [40];
  undefined1 *local_a48;
  long local_a40 [8];
  long *local_a00;
  long local_9f8 [8];
  long *local_9b8;
  undefined1 local_9ac [28];
  undefined1 *local_990;
  MFIter local_988;
  IntVect local_924;
  type local_918;
  MFItInfo local_910;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  type local_738;
  undefined8 local_72c;
  undefined8 local_724;
  undefined8 local_71c;
  undefined4 local_714;
  int *local_710;
  Box *local_708;
  IntVect local_700;
  undefined8 local_6ec;
  int local_6e4;
  undefined8 *local_6e0;
  Geometry *local_6d8;
  int local_6d0;
  int local_6cc;
  LinOpBCType local_6c8 [3];
  undefined8 local_6b4;
  LinOpBCType local_6ac;
  LinOpBCType local_6a8 [3];
  undefined8 local_698;
  LinOpBCType local_690;
  undefined4 local_68c;
  LinOpBCType *local_688;
  undefined4 local_67c;
  LinOpBCType *local_678;
  char *local_668;
  undefined4 local_65c;
  char *local_658;
  char *local_650;
  undefined8 local_648;
  int local_640;
  int *local_638;
  int local_62c;
  int iStack_628;
  int local_624;
  undefined8 local_620;
  int local_618;
  int *local_610;
  int local_604;
  int iStack_600;
  int local_5fc;
  Box *local_5f8;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  undefined8 local_5c0;
  int local_5b8;
  undefined8 local_5ac;
  int local_5a4;
  undefined8 local_5a0;
  int local_598;
  undefined8 local_590;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  undefined8 *local_538;
  undefined8 *local_530;
  int *local_528;
  long *local_520;
  long *local_518;
  Box *local_510;
  undefined8 local_508;
  int local_500;
  int *local_4f8;
  int local_4ec;
  int iStack_4e8;
  int local_4e4;
  Box *local_4d0;
  undefined8 local_4b8;
  int local_4b0;
  int *local_4a8;
  int local_49c;
  int iStack_498;
  int local_494;
  Box *local_480;
  int local_46c;
  int local_468;
  int local_464;
  long *local_460;
  int local_454;
  int local_450;
  int local_44c;
  long *local_448;
  int local_43c;
  int local_438;
  int local_434;
  long *local_430;
  int local_424;
  int local_420;
  int local_41c;
  long *local_418;
  int local_40c;
  int local_408;
  int local_404;
  long *local_400;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  long *local_3e8;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  long *local_3d0;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  long *local_3b8;
  int local_3ac;
  long *local_3a8;
  long *local_3a0;
  int local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  int local_250;
  long *local_248;
  int local_23c;
  int local_238;
  long *local_230;
  int local_224;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_204;
  long *local_200;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  int local_1d8;
  int local_1d4;
  long *local_1d0;
  undefined4 local_1c4;
  int *local_1c0;
  undefined4 local_1b4;
  int *local_1b0;
  undefined4 local_1a4;
  int *local_1a0;
  undefined4 local_194;
  int *local_190;
  undefined4 local_184;
  int *local_180;
  undefined4 local_174;
  int *local_170;
  undefined4 local_164;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  undefined4 local_144;
  IntVect *local_140;
  undefined4 local_134;
  Box *local_130;
  undefined4 local_124;
  Box *local_120;
  undefined4 local_114;
  Box *local_110;
  undefined4 local_104;
  int *local_100;
  undefined4 local_f4;
  int *local_f0;
  undefined4 local_e4;
  int *local_e0;
  undefined4 local_d4;
  int *local_d0;
  undefined4 local_c4;
  int *local_c0;
  undefined4 local_b4;
  int *local_b0;
  int local_a4;
  undefined8 *local_a0;
  int local_94;
  undefined4 *local_90;
  undefined4 local_88;
  int local_84;
  long local_80;
  undefined4 *local_78;
  int local_6c;
  undefined4 *local_68;
  int local_60;
  undefined4 local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  if ((*(byte *)(in_RDI + 0x565) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x565) = 1;
    *(undefined1 *)(in_RDI + 0x564) = 0;
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x19212bb);
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x19212e3);
    local_67c = 0x65;
    local_678 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                          ((LinOpBCType *)
                           CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0),
                           in_stack_ffffffffffffeed8,(LinOpBCType *)in_stack_ffffffffffffeed0);
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x192132e);
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x1921356);
    local_68c = 0x65;
    local_688 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                          ((LinOpBCType *)
                           CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0),
                           in_stack_ffffffffffffeed8,(LinOpBCType *)in_stack_ffffffffffffeed0);
    pLVar3 = local_678;
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    pvVar6 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x19213b1);
    pLVar2 = local_688;
    if (pLVar3 == pvVar6) {
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      pvVar6 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x19213f5)
      ;
      if (pLVar2 == pvVar6) {
        piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                            (size_type)in_stack_ffffffffffffeeb8);
        local_1039 = 0;
        if (*piVar7 != 0) {
          local_1039 = *(byte *)(in_RDI + 0x566) ^ 0xff;
        }
        *(byte *)(in_RDI + 0x564) = local_1039 & 1;
      }
    }
    GVar10 = MLLinOp::LoBC(in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20)
                          );
    local_6a8[2] = GVar10.arr[2];
    local_690 = local_6a8[2];
    local_6a8._0_8_ = GVar10.arr._0_8_;
    local_698._0_4_ = local_6a8[0];
    local_698._4_4_ = local_6a8[1];
    local_6a8 = GVar10.arr;
    local_6c8 = (LinOpBCType  [3])
                MLLinOp::HiBC(in_stack_ffffffffffffeed0,
                              (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20));
    local_6b4 = (MFIter *)local_6c8._0_8_;
    local_6ac = local_6c8[2];
    for (local_6cc = 0; local_6cc < *(int *)(in_RDI + 0x34); local_6cc = local_6cc + 1) {
      for (local_6d0 = 0; iVar5 = local_6d0,
          piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                              (size_type)in_stack_ffffffffffffeeb8), iVar5 < *piVar7;
          local_6d0 = local_6d0 + 1) {
        Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                     (size_type)in_stack_ffffffffffffeeb8);
        local_6d8 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                               CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                               (size_type)in_stack_ffffffffffffeeb8);
        PVar11 = Geometry::periodicity(in_stack_ffffffffffffeef0);
        local_700.vect._0_8_ = PVar11.period.vect._0_8_;
        local_6ec._0_4_ = local_700.vect[0];
        local_6ec._4_4_ = local_700.vect[1];
        local_700.vect[2] = PVar11.period.vect[2];
        local_6e4 = local_700.vect[2];
        local_6e0 = &local_6ec;
        local_700 = PVar11.period.vect;
        local_708 = Geometry::Domain(local_6d8);
        local_72c = *(undefined8 *)(local_708->smallend).vect;
        local_724 = *(undefined8 *)((local_708->smallend).vect + 2);
        local_71c = *(undefined8 *)((local_708->bigend).vect + 1);
        uVar1 = (local_708->btype).itype;
        local_a0 = &local_72c;
        for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
          local_90 = &local_714;
          local_94 = local_a4;
          local_6c = local_a4;
          local_60 = local_a4;
          if ((uVar1 & 1 << ((byte)local_a4 & 0x1f)) == 0) {
            local_80 = (long)&local_724 + 4;
            local_84 = local_a4;
            local_88 = 1;
            *(int *)(local_80 + (long)local_a4 * 4) = *(int *)(local_80 + (long)local_a4 * 4) + 1;
          }
          local_68 = local_90;
        }
        local_78 = &local_714;
        local_714 = 7;
        local_710 = (int *)&local_72c;
        local_5f8 = local_708;
        Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                     (size_type)in_stack_ffffffffffffeeb8);
        Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                     (size_type)in_stack_ffffffffffffeeb8);
        local_738 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::
                    operator*((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                               *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
        Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                     (size_type)in_stack_ffffffffffffeeb8);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
        Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                     (size_type)in_stack_ffffffffffffeeb8);
        Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                  ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
        local_8d8 = 0;
        uStack_8d0 = 0;
        local_8e8 = 0;
        uStack_8e0 = 0;
        local_8c8 = 0;
        MFInfo::MFInfo((MFInfo *)0x192183d);
        local_8f0 = 0;
        puVar12 = &local_8f0;
        DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::IArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
        iMultiFab::iMultiFab
                  (in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
                   (DistributionMapping *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
                   in_stack_ffffffffffffeee8,
                   (MFInfo *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0),
                   in_stack_ffffffffffffef10);
        DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::IArrayBox> *)0x19218a9);
        MFInfo::~MFInfo((MFInfo *)0x19218b6);
        in_stack_ffffffffffffeeb8 = (MFIter *)((ulong)puVar12 & 0xffffffff00000000);
        FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                  ((FabArray<amrex::IArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                   in_stack_fffffffffffff0d8,(Periodicity *)in_stack_fffffffffffff0d0,
                   in_stack_fffffffffffff0cc,in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c4,
                   in_stack_fffffffffffff2b0);
        MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffeed0);
        MFItInfo::SetDynamic(&local_910,true);
        if (((*(byte *)(in_RDI + 0x566) & 1) != 0) && (0 < local_6d0)) {
          Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
          ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                       (size_type)in_stack_ffffffffffffeeb8);
          Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                       (size_type)in_stack_ffffffffffffeeb8);
          local_918 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::
                      operator*((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                                 *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
          IntVect::IntVect(&local_924,2);
          average_down_nodal<amrex::IArrayBox>
                    ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff300,
                     (FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff2f8,
                     (IntVect *)in_stack_fffffffffffff2f0,in_stack_fffffffffffff2ec,
                     (bool)(char)((uint)in_stack_fffffffffffff2e8 >> 0x18));
        }
        MFIter::MFIter((MFIter *)in_stack_ffffffffffffeef0,
                       (FabArrayBase *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8)
                       ,(MFItInfo *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
        while (bVar4 = MFIter::isValid(&local_988), bVar4) {
          MFIter::validbox((MFIter *)in_stack_ffffffffffffeed0);
          local_990 = local_9ac;
          FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                    (in_stack_ffffffffffffeec8,
                     (MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
          local_9b8 = local_9f8;
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (in_stack_ffffffffffffeec8,
                     (MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
          local_a00 = local_a40;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
          local_a48 = local_a70;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
          while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                   (&local_a88,&local_aa0), bVar4) {
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_abc,&local_a88);
            local_518 = local_9b8;
            local_520 = local_a00;
            local_528 = local_710;
            local_530 = &local_698;
            local_538 = &local_6b4;
            local_114 = 0;
            local_124 = 1;
            local_134 = 2;
            local_140 = &local_abc.bigend;
            local_144 = 0;
            local_150 = &local_abc.bigend;
            local_154 = 1;
            local_160 = &local_abc.bigend;
            local_164 = 2;
            for (local_57c = local_abc.smallend.vect[2]; iVar5 = local_abc.smallend.vect[1],
                local_57c <= local_abc.bigend.vect[2]; local_57c = local_57c + 1) {
              while (local_580 = iVar5, iVar5 = local_abc.smallend.vect[0],
                    local_580 <= local_abc.bigend.vect[1]) {
                while (local_584 = iVar5, local_584 <= local_abc.bigend.vect[0]) {
                  local_260 = local_9b8;
                  local_264 = local_584;
                  local_268 = local_580;
                  local_26c = local_57c;
                  if (*(int *)(*local_9b8 +
                              ((long)(local_584 - (int)local_9b8[4]) +
                               (long)(local_580 - *(int *)((long)local_9b8 + 0x24)) * local_9b8[1] +
                              (long)(local_57c - (int)local_9b8[5]) * local_9b8[2]) * 4) == 0) {
                    local_3bc = local_584 + -1;
                    local_3c0 = local_580 + -1;
                    local_3c4 = local_57c + -1;
                    local_3b8 = local_a00;
                    local_1099 = true;
                    if (*(int *)(*local_a00 +
                                ((long)(local_3bc - (int)local_a00[4]) +
                                 (long)(local_3c0 - *(int *)((long)local_a00 + 0x24)) * local_a00[1]
                                + (long)(local_3c4 - (int)local_a00[5]) * local_a00[2]) * 4) != 1) {
                      local_3d8 = local_580 + -1;
                      local_3dc = local_57c + -1;
                      local_3d0 = local_a00;
                      local_3d4 = local_584;
                      local_1099 = true;
                      if (*(int *)(*local_a00 +
                                  ((long)(local_584 - (int)local_a00[4]) +
                                   (long)(local_3d8 - *(int *)((long)local_a00 + 0x24)) *
                                   local_a00[1] +
                                  (long)(local_3dc - (int)local_a00[5]) * local_a00[2]) * 4) != 1) {
                        local_3ec = local_584 + -1;
                        local_3f4 = local_57c + -1;
                        local_3e8 = local_a00;
                        local_3f0 = local_580;
                        local_1099 = true;
                        if (*(int *)(*local_a00 +
                                    ((long)(local_3ec - (int)local_a00[4]) +
                                     (long)(local_580 - *(int *)((long)local_a00 + 0x24)) *
                                     local_a00[1] +
                                    (long)(local_3f4 - (int)local_a00[5]) * local_a00[2]) * 4) != 1)
                        {
                          local_40c = local_57c + -1;
                          local_400 = local_a00;
                          local_404 = local_584;
                          local_408 = local_580;
                          local_1099 = true;
                          if (*(int *)(*local_a00 +
                                      ((long)(local_584 - (int)local_a00[4]) +
                                       (long)(local_580 - *(int *)((long)local_a00 + 0x24)) *
                                       local_a00[1] +
                                      (long)(local_40c - (int)local_a00[5]) * local_a00[2]) * 4) !=
                              1) {
                            local_41c = local_584 + -1;
                            local_420 = local_580 + -1;
                            local_418 = local_a00;
                            local_424 = local_57c;
                            local_1099 = true;
                            if (*(int *)(*local_a00 +
                                        ((long)(local_41c - (int)local_a00[4]) +
                                         (long)(local_420 - *(int *)((long)local_a00 + 0x24)) *
                                         local_a00[1] +
                                        (long)(local_57c - (int)local_a00[5]) * local_a00[2]) * 4)
                                != 1) {
                              local_438 = local_580 + -1;
                              local_430 = local_a00;
                              local_434 = local_584;
                              local_43c = local_57c;
                              local_1099 = true;
                              if (*(int *)(*local_a00 +
                                          ((long)(local_584 - (int)local_a00[4]) +
                                           (long)(local_438 - *(int *)((long)local_a00 + 0x24)) *
                                           local_a00[1] +
                                          (long)(local_57c - (int)local_a00[5]) * local_a00[2]) * 4)
                                  != 1) {
                                local_44c = local_584 + -1;
                                local_448 = local_a00;
                                local_450 = local_580;
                                local_454 = local_57c;
                                local_1099 = true;
                                if (*(int *)(*local_a00 +
                                            ((long)(local_44c - (int)local_a00[4]) +
                                             (long)(local_580 - *(int *)((long)local_a00 + 0x24)) *
                                             local_a00[1] +
                                            (long)(local_57c - (int)local_a00[5]) * local_a00[2]) *
                                            4) != 1) {
                                  local_460 = local_a00;
                                  local_464 = local_584;
                                  local_468 = local_580;
                                  local_46c = local_57c;
                                  local_1099 = *(int *)(*local_a00 +
                                                       ((long)(local_584 - (int)local_a00[4]) +
                                                        (long)(local_580 -
                                                              *(int *)((long)local_a00 + 0x24)) *
                                                        local_a00[1] +
                                                       (long)(local_57c - (int)local_a00[5]) *
                                                       local_a00[2]) * 4) == 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    local_278 = local_9b8;
                    local_27c = local_584;
                    local_280 = local_580;
                    local_284 = local_57c;
                    *(uint *)(*local_9b8 +
                             ((long)(local_584 - (int)local_9b8[4]) +
                              (long)(local_580 - *(int *)((long)local_9b8 + 0x24)) * local_9b8[1] +
                             (long)(local_57c - (int)local_9b8[5]) * local_9b8[2]) * 4) =
                         (uint)local_1099;
                  }
                  iVar5 = local_584 + 1;
                }
                iVar5 = local_580 + 1;
              }
            }
            local_4f8 = local_710;
            local_170 = local_710;
            local_174 = 0;
            local_4ec = *local_710;
            local_180 = local_710;
            local_184 = 1;
            iStack_4e8 = local_710[1];
            local_5a0 = *(undefined8 *)local_710;
            local_190 = local_710;
            local_194 = 2;
            local_598 = local_710[2];
            local_4a8 = local_710;
            local_1a0 = local_710 + 3;
            local_1a4 = 0;
            local_49c = *local_1a0;
            local_1b0 = local_710 + 3;
            local_1b4 = 1;
            iStack_498 = local_710[4];
            local_5c0 = *(undefined8 *)local_1a0;
            local_1c0 = local_710 + 3;
            local_1c4 = 2;
            local_5b8 = local_710[5];
            local_c = 0;
            if (((int)local_698 == 0x65) &&
               (iVar5 = local_abc.smallend.vect[2], local_abc.smallend.vect[0] == local_4ec)) {
              while (local_5c4 = iVar5, iVar5 = local_abc.smallend.vect[1],
                    local_5c4 <= local_abc.bigend.vect[2]) {
                while (local_5c8 = iVar5, local_5c8 <= local_abc.bigend.vect[1]) {
                  local_248 = local_9b8;
                  local_250 = local_5c8;
                  local_254 = local_5c4;
                  *(undefined4 *)
                   (*local_9b8 +
                   ((long)(local_abc.smallend.vect[0] - (int)local_9b8[4]) +
                    (long)(local_5c8 - *(int *)((long)local_9b8 + 0x24)) * local_9b8[1] +
                   (long)(local_5c4 - (int)local_9b8[5]) * local_9b8[2]) * 4) = 1;
                  iVar5 = local_5c8 + 1;
                }
                iVar5 = local_5c4 + 1;
              }
            }
            local_1c = 0;
            if (((int)local_6b4 == 0x65) &&
               (iVar5 = local_abc.smallend.vect[2], local_abc.bigend.vect[0] == local_49c)) {
              while (local_5cc = iVar5, iVar5 = local_abc.smallend.vect[1],
                    local_5cc <= local_abc.bigend.vect[2]) {
                while (local_5d0 = iVar5, local_5d0 <= local_abc.bigend.vect[1]) {
                  local_230 = local_9b8;
                  local_238 = local_5d0;
                  local_23c = local_5cc;
                  *(undefined4 *)
                   (*local_9b8 +
                   ((long)(local_abc.bigend.vect[0] - (int)local_9b8[4]) +
                    (long)(local_5d0 - *(int *)((long)local_9b8 + 0x24)) * local_9b8[1] +
                   (long)(local_5cc - (int)local_9b8[5]) * local_9b8[2]) * 4) = 1;
                  iVar5 = local_5d0 + 1;
                }
                iVar5 = local_5cc + 1;
              }
            }
            local_2c = 1;
            if ((local_698._4_4_ == 0x65) &&
               (iVar5 = local_abc.smallend.vect[2], local_abc.smallend.vect[1] == iStack_4e8)) {
              while (local_5d4 = iVar5, iVar5 = local_abc.smallend.vect[0],
                    local_5d4 <= local_abc.bigend.vect[2]) {
                while (local_5d8 = iVar5, local_5d8 <= local_abc.bigend.vect[0]) {
                  local_218 = local_9b8;
                  local_21c = local_5d8;
                  local_224 = local_5d4;
                  *(undefined4 *)
                   (*local_9b8 +
                   ((long)(local_5d8 - (int)local_9b8[4]) +
                    (long)(local_abc.smallend.vect[1] - *(int *)((long)local_9b8 + 0x24)) *
                    local_9b8[1] + (long)(local_5d4 - (int)local_9b8[5]) * local_9b8[2]) * 4) = 1;
                  iVar5 = local_5d8 + 1;
                }
                iVar5 = local_5d4 + 1;
              }
            }
            local_3c = 1;
            if ((local_6b4._4_4_ == 0x65) &&
               (iVar5 = local_abc.smallend.vect[2], local_abc.bigend.vect[1] == iStack_498)) {
              while (local_5dc = iVar5, iVar5 = local_abc.smallend.vect[0],
                    local_5dc <= local_abc.bigend.vect[2]) {
                while (local_5e0 = iVar5, local_5e0 <= local_abc.bigend.vect[0]) {
                  local_200 = local_9b8;
                  local_204 = local_5e0;
                  local_20c = local_5dc;
                  *(undefined4 *)
                   (*local_9b8 +
                   ((long)(local_5e0 - (int)local_9b8[4]) +
                    (long)(local_abc.bigend.vect[1] - *(int *)((long)local_9b8 + 0x24)) *
                    local_9b8[1] + (long)(local_5dc - (int)local_9b8[5]) * local_9b8[2]) * 4) = 1;
                  iVar5 = local_5e0 + 1;
                }
                iVar5 = local_5dc + 1;
              }
            }
            local_4c = 2;
            if ((local_690 == Dirichlet) &&
               (iVar5 = local_abc.smallend.vect[1], local_abc.smallend.vect[2] == local_598)) {
              while (local_5e4 = iVar5, iVar5 = local_abc.smallend.vect[0],
                    local_5e4 <= local_abc.bigend.vect[1]) {
                while (local_5e8 = iVar5, local_5e8 <= local_abc.bigend.vect[0]) {
                  local_1e8 = local_9b8;
                  local_1ec = local_5e8;
                  local_1f0 = local_5e4;
                  *(undefined4 *)
                   (*local_9b8 +
                   ((long)(local_5e8 - (int)local_9b8[4]) +
                    (long)(local_5e4 - *(int *)((long)local_9b8 + 0x24)) * local_9b8[1] +
                   (long)(local_abc.smallend.vect[2] - (int)local_9b8[5]) * local_9b8[2]) * 4) = 1;
                  iVar5 = local_5e8 + 1;
                }
                iVar5 = local_5e4 + 1;
              }
            }
            local_5c = 2;
            if ((local_6ac == Dirichlet) &&
               (iVar5 = local_abc.smallend.vect[1], local_abc.bigend.vect[2] == local_5b8)) {
              while (local_5ec = iVar5, iVar5 = local_abc.smallend.vect[0],
                    local_5ec <= local_abc.bigend.vect[1]) {
                while (local_5f0 = iVar5, local_5f0 <= local_abc.bigend.vect[0]) {
                  local_1d0 = local_9b8;
                  local_1d4 = local_5f0;
                  local_1d8 = local_5ec;
                  *(undefined4 *)
                   (*local_9b8 +
                   ((long)(local_5f0 - (int)local_9b8[4]) +
                    (long)(local_5ec - *(int *)((long)local_9b8 + 0x24)) * local_9b8[1] +
                   (long)(local_abc.bigend.vect[2] - (int)local_9b8[5]) * local_9b8[2]) * 4) = 1;
                  iVar5 = local_5f0 + 1;
                }
                iVar5 = local_5ec + 1;
              }
            }
            local_5ac = local_5c0;
            local_5a4 = local_5b8;
            local_590 = local_5a0;
            local_588 = local_598;
            local_510 = &local_abc;
            local_508 = local_5a0;
            local_500 = local_598;
            local_4e4 = local_598;
            local_4d0 = &local_abc;
            local_4b8 = local_5c0;
            local_4b0 = local_5b8;
            local_494 = local_5b8;
            local_480 = &local_abc;
            local_130 = &local_abc;
            local_120 = &local_abc;
            local_110 = &local_abc;
            local_58 = local_538;
            local_48 = local_530;
            local_38 = local_538;
            local_28 = local_530;
            local_18 = local_538;
            local_8 = local_530;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_a88);
          }
          MFIter::operator++(&local_988);
        }
        MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
        iMultiFab::~iMultiFab((iMultiFab *)0x1922e0e);
      }
    }
    for (local_ac0 = 0; local_ac0 < *(int *)(in_RDI + 0x34) + -1; local_ac0 = local_ac0 + 1) {
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      local_ac8 = (FabArrayBase *)
                  std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::
                  operator*((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                            CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      local_ad0 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::
                  operator*((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                            CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      local_ad8 = (FabArray<amrex::IArrayBox> *)
                  std::
                  unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                  ::operator*((unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                               *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      pGVar8 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                          (size_type)in_stack_ffffffffffffeeb8);
      local_ae0 = Geometry::Domain(pGVar8);
      iVar5 = MLLinOp::AMRRefRatio
                        ((MLLinOp *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                         (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20));
      if ((iVar5 != 2) &&
         (iVar5 = MLLinOp::AMRRefRatio
                            ((MLLinOp *)
                             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                             (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20)), iVar5 != 4)) {
        local_650 = "AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4";
        local_658 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
        ;
        local_65c = 0x149;
        local_668 = "\"ref_ratio != 2 and 4 not supported\"";
        Assert_host(in_stack_fffffffffffff0f0,(char *)in_stack_fffffffffffff0e8,
                    in_stack_fffffffffffff0e4,(char *)in_stack_fffffffffffff0d8);
      }
      pFVar13 = local_ac8;
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      piVar9 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                         ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                          CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      LVar14 = (LinOpBCType)piVar9;
      local_c80 = (int  [3])FabArrayBase::nGrowVect(local_ac8);
      local_c68 = local_c80[2];
      local_c70 = local_c80._0_8_;
      iVar5 = MLLinOp::AMRRefRatio
                        ((MLLinOp *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                         (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20));
      IntVect::IntVect(&local_c8c,iVar5);
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                   (size_type)in_stack_ffffffffffffeeb8);
      Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                 CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
      Geometry::periodicity(in_stack_ffffffffffffeef0);
      in_stack_ffffffffffffeeb8 = (MFIter *)((ulong)in_stack_ffffffffffffeeb8 & 0xffffffff00000000);
      in_stack_ffffffffffffeec0 = 1;
      this_01 = local_ad8;
      makeFineMask<amrex::IArrayBox>
                ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff2f8,
                 (FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff2f0,
                 (IntVect *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (IntVect *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
                 in_stack_fffffffffffff330,in_stack_fffffffffffff338,in_stack_fffffffffffff340);
      iMultiFab::operator=
                ((iMultiFab *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (iMultiFab *)in_stack_ffffffffffffeeb8);
      iMultiFab::~iMultiFab((iMultiFab *)0x1923122);
      MFIter::MFIter((MFIter *)in_stack_ffffffffffffeef0,
                     (FabArrayBase *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
                     in_stack_ffffffffffffeee7);
      while (bVar4 = MFIter::isValid((MFIter *)&stack0xfffffffffffff2f8), bVar4) {
        MFIter::validbox((MFIter *)in_stack_ffffffffffffeed0);
        in_stack_fffffffffffff2f0 = &stack0xfffffffffffff2d4;
        FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                  (this_01,(MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
        local_d84 = local_698;
        local_d7c = local_690;
        local_d90 = local_6b4;
        local_d88 = local_6ac;
        local_da0 = local_698;
        local_d98 = local_690;
        GVar10.arr[1]._3_1_ = in_stack_ffffffffffffeee7;
        GVar10.arr._0_7_ = in_stack_ffffffffffffeee0;
        GVar10.arr[2] = in_stack_ffffffffffffeee8;
        bchi.arr[2] = LVar14;
        bchi.arr._0_8_ = pFVar13;
        in_stack_ffffffffffffeeb8 = local_6b4;
        in_stack_ffffffffffffeec0 = local_6ac;
        mlndlap_fillbc_cc<int>
                  ((Box *)this_01,(Array4<int> *)CONCAT44(in_stack_ffffffffffffeec4,local_6ac),
                   (Box *)local_6b4,GVar10,bchi);
        MFIter::operator++((MFIter *)&stack0xfffffffffffff2f8);
      }
      MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      TilingIfNotGPU();
      MFIter::MFIter((MFIter *)in_stack_ffffffffffffeef0,
                     (FabArrayBase *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
                     (bool)in_stack_ffffffffffffeee7);
      while (bVar4 = MFIter::isValid(&local_e00), bVar4) {
        MFIter::tilebox(in_stack_ffffffffffffef20);
        local_e08 = local_e24;
        FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                  (this_01,(MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
        local_e30 = local_e70;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (this_01,(MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
        local_638 = local_e08;
        local_b0 = local_e08;
        local_b4 = 0;
        local_62c = *local_e08;
        local_c0 = local_e08;
        local_c4 = 1;
        iStack_628 = local_e08[1];
        local_648 = *(undefined8 *)local_e08;
        local_d0 = local_e08;
        local_d4 = 2;
        local_640 = local_e08[2];
        local_610 = local_e08;
        local_e0 = local_e08 + 3;
        local_e4 = 0;
        local_604 = *local_e0;
        local_f0 = local_e08 + 3;
        local_f4 = 1;
        iStack_600 = local_e08[4];
        local_620 = *(undefined8 *)local_e0;
        local_100 = local_e08 + 3;
        local_104 = 2;
        local_618 = local_e08[5];
        for (local_efc = local_640; local_f00 = iStack_628, local_efc <= local_618;
            local_efc = local_efc + 1) {
          for (; local_f04 = local_62c, local_f00 <= iStack_600; local_f00 = local_f00 + 1) {
            for (; local_f04 <= local_604; local_f04 = local_f04 + 1) {
              local_390 = local_f04;
              local_394 = local_f00;
              local_398 = local_efc;
              local_3a0 = local_e30;
              local_2dc = local_f04 + -1;
              local_2e0 = local_f00 + -1;
              local_2e4 = local_efc + -1;
              local_2f4 = local_f04;
              local_2f8 = local_f00 + -1;
              local_2fc = local_efc + -1;
              local_30c = local_f04 + -1;
              local_310 = local_f00;
              local_314 = local_efc + -1;
              local_324 = local_f04;
              local_328 = local_f00;
              local_32c = local_efc + -1;
              local_33c = local_f04 + -1;
              local_340 = local_f00 + -1;
              local_344 = local_efc;
              local_354 = local_f04;
              local_358 = local_f00 + -1;
              local_35c = local_efc;
              local_36c = local_f04 + -1;
              local_370 = local_f00;
              local_374 = local_efc;
              local_384 = local_f04;
              local_388 = local_f00;
              local_38c = local_efc;
              local_3ac = *(int *)(local_eb8 +
                                  ((long)(local_2dc - local_e98) +
                                   (local_2e0 - local_e94) * local_eb0 +
                                  (local_2e4 - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_f04 - local_e98) +
                                   (local_2f8 - local_e94) * local_eb0 +
                                  (local_2fc - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_30c - local_e98) +
                                   (local_f00 - local_e94) * local_eb0 +
                                  (local_314 - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_f04 - local_e98) +
                                   (local_f00 - local_e94) * local_eb0 +
                                  (local_32c - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_33c - local_e98) +
                                   (local_340 - local_e94) * local_eb0 +
                                  (local_efc - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_f04 - local_e98) +
                                   (local_358 - local_e94) * local_eb0 +
                                  (local_efc - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_36c - local_e98) +
                                   (local_f00 - local_e94) * local_eb0 +
                                  (local_efc - local_e90) * local_ea8) * 4) +
                          *(int *)(local_eb8 +
                                  ((long)(local_f04 - local_e98) +
                                   (local_f00 - local_e94) * local_eb0 +
                                  (local_efc - local_e90) * local_ea8) * 4);
              if (local_3ac == 0) {
                local_2c0 = local_e30;
                local_2c4 = local_f04;
                local_2c8 = local_f00;
                local_2cc = local_efc;
                *(undefined4 *)
                 (*local_e30 +
                 ((long)(local_f04 - (int)local_e30[4]) +
                  (long)(local_f00 - *(int *)((long)local_e30 + 0x24)) * local_e30[1] +
                 (long)(local_efc - (int)local_e30[5]) * local_e30[2]) * 4) = 0;
              }
              else if (local_3ac == 8) {
                local_2a8 = local_e30;
                local_2ac = local_f04;
                local_2b0 = local_f00;
                local_2b4 = local_efc;
                *(undefined4 *)
                 (*local_e30 +
                 ((long)(local_f04 - (int)local_e30[4]) +
                  (long)(local_f00 - *(int *)((long)local_e30 + 0x24)) * local_e30[1] +
                 (long)(local_efc - (int)local_e30[5]) * local_e30[2]) * 4) = 2;
              }
              else {
                local_290 = local_e30;
                local_294 = local_f04;
                local_298 = local_f00;
                local_29c = local_efc;
                *(undefined4 *)
                 (*local_e30 +
                 ((long)(local_f04 - (int)local_e30[4]) +
                  (long)(local_f00 - *(int *)((long)local_e30 + 0x24)) * local_e30[1] +
                 (long)(local_efc - (int)local_e30[5]) * local_e30[2]) * 4) = 1;
              }
              local_3a8 = &local_eb8;
              local_380 = &local_eb8;
              local_368 = &local_eb8;
              local_350 = &local_eb8;
              local_338 = &local_eb8;
              local_320 = &local_eb8;
              local_308 = &local_eb8;
              local_2f0 = &local_eb8;
              local_2d8 = &local_eb8;
            }
          }
        }
        local_e78 = &local_eb8;
        local_624 = local_640;
        local_5fc = local_618;
        MFIter::operator++(&local_e00);
      }
      MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
    }
    Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>::
    operator*((unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> *)
              CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
    MFIter::MFIter((MFIter *)in_stack_ffffffffffffeef0,
                   (FabArrayBase *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
                   in_stack_ffffffffffffeee7);
    while (bVar4 = MFIter::isValid((MFIter *)&stack0xfffffffffffff090), bVar4) {
      piVar7 = LayoutData<int>::operator[]
                         ((LayoutData<int> *)
                          CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                          in_stack_ffffffffffffeeb8);
      *piVar7 = 0;
      MFIter::operator++((MFIter *)&stack0xfffffffffffff090);
    }
    MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
    uVar15 = 0;
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                        (size_type)in_stack_ffffffffffffeeb8);
    iVar5 = *piVar7 + -1;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                 (size_type)in_stack_ffffffffffffeeb8);
    pGVar8 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                        (size_type)in_stack_ffffffffffffeeb8);
    strategy = (CoarseningStrategy)((ulong)pGVar8 >> 0x20);
    local_f88 = (FabArrayBase *)
                std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                          ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                           CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
    bxs = (BoxArray *)(in_RDI + 0x248);
    this_00 = FabArrayBase::boxArray(local_f88);
    FabArrayBase::DistributionMap(local_f88);
    local_fa8 = 0;
    uStack_fa0 = 0;
    local_fc0.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uStack_fb0 = 0;
    local_f98 = 0;
    factory = &local_fc0.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    MFInfo::MFInfo((MFInfo *)0x1923dd4);
    local_fc0.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    dm = &local_fc0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
    dm_00 = dm;
    MultiFab::define((MultiFab *)this_00,bxs,dm,(int)((ulong)in_stack_ffffffffffffeef8 >> 0x20),
                     (int)in_stack_ffffffffffffeef8,(MFInfo *)in_stack_ffffffffffffeef0,
                     (FabFactory<amrex::FArrayBox> *)factory);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x1923e2d);
    MFInfo::~MFInfo((MFInfo *)0x1923e3a);
    anon_unknown_1::MLNodeLinOp_set_dot_mask
              (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (Geometry *)in_stack_fffffffffffff098,
               (GpuArray<amrex::LinOpBCType,_3U> *)in_stack_fffffffffffff090._M_head_impl,
               (GpuArray<amrex::LinOpBCType,_3U> *)CONCAT44(uVar15,iVar5),strategy);
    if ((*(byte *)(in_RDI + 0x564) & 1) != 0) {
      local_fc4 = 0;
      local_fc8 = 0;
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),(size_type)dm);
      local_fd0 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                             CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                             (size_type)dm);
      local_fd8 = (FabArrayBase *)
                  std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::
                  operator*((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                            CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      FabArrayBase::boxArray(local_fd8);
      info = (MFInfo *)FabArrayBase::DistributionMap(local_fd8);
      local_ff8 = 0;
      uStack_ff0 = 0;
      local_1008 = 0;
      uStack_1000 = 0;
      local_fe8 = 0;
      puVar12 = &local_1008;
      MFInfo::MFInfo((MFInfo *)0x1923f5e);
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0));
      MultiFab::define((MultiFab *)this_00,bxs,dm_00,(int)((ulong)puVar12 >> 0x20),(int)puVar12,info
                       ,(FabFactory<amrex::FArrayBox> *)factory);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x1923fb7);
      MFInfo::~MFInfo((MFInfo *)0x1923fc4);
      anon_unknown_1::MLNodeLinOp_set_dot_mask
                (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (Geometry *)in_stack_fffffffffffff098,
                 (GpuArray<amrex::LinOpBCType,_3U> *)in_stack_fffffffffffff090._M_head_impl,
                 (GpuArray<amrex::LinOpBCType,_3U> *)CONCAT44(uVar15,iVar5),strategy);
    }
  }
  return;
}

Assistant:

void
MLNodeLinOp::buildMasks ()
{
    if (m_masks_built) return;

    BL_PROFILE("MLNodeLinOp::buildMasks()");

    m_masks_built = true;

    m_is_bottom_singular = false;
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end())
    {  // No Dirichlet
        m_is_bottom_singular = (m_domain_covered[0] && !m_overset_dirichlet_mask);
    }

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const Geometry& geom = m_geom[amrlev][mglev];
            const auto& period = geom.periodicity();
            const Box& ccdomain = geom.Domain();
            const Box& nddomain = amrex::surroundingNodes(ccdomain);

            auto& dmask = *m_dirichlet_mask[amrlev][mglev];

            iMultiFab ccm(m_grids[amrlev][mglev],m_dmap[amrlev][mglev],1,1);
            ccm.BuildMask(ccdomain,period,0,1,2,0);

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

            if (m_overset_dirichlet_mask && mglev > 0) {
                const auto& dmask_fine = *m_dirichlet_mask[amrlev][mglev-1];
                amrex::average_down_nodal(dmask_fine, dmask, IntVect(2));
            }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(dmask, mfi_info); mfi.isValid(); ++mfi)
            {
                const Box& ndbx = mfi.validbox();
                Array4<int> const& mskarr = dmask.array(mfi);
                Array4<int const> const& ccarr = ccm.const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( ndbx, tbx,
                {
                    mlndlap_set_dirichlet_mask(tbx, mskarr, ccarr, nddomain, lobc, hibc);
                });
            }
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev)
    {
        iMultiFab& cc_mask = *m_cc_fine_mask[amrlev];
        iMultiFab& nd_mask = *m_nd_fine_mask[amrlev];
        LayoutData<int>& has_cf = *m_has_fine_bndry[amrlev];
        const Box& ccdom = m_geom[amrlev][0].Domain();

        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4,
                                         "ref_ratio != 2 and 4 not supported");

        cc_mask = amrex::makeFineMask(cc_mask, *m_cc_fine_mask[amrlev+1], cc_mask.nGrowVect(),
                                      IntVect(AMRRefRatio(amrlev)), m_geom[amrlev][0].periodicity(),
                                      0, 1, has_cf); // coarse: 0, fine: 1

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(cc_mask); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            Array4<int> const& fab = cc_mask.array(mfi);
            mlndlap_fillbc_cc<int>(bx,fab,ccdom,lobc,hibc);
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(nd_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<int> const& nmsk = nd_mask.array(mfi);
            Array4<int const> const& cmsk = cc_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_set_nodal_mask(i,j,k,nmsk,cmsk);
            });
        }
    }

    auto& has_cf = *m_has_fine_bndry[m_num_amr_levels-1];
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(has_cf); mfi.isValid(); ++mfi)
    {
        has_cf[mfi] = 0;
    }

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_bottom;
        m_bottom_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_bottom_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_top;
        m_coarse_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_coarse_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }
}